

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unsubtyping.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_22::Unsubtyping::noteSubtype(Unsubtyping *this,HeapType sub,HeapType super)

{
  bool bVar1;
  HeapType super_00;
  HeapType right;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_wasm::HeapType>,_false,_true>,_bool>
  pVar2;
  HeapType local_30;
  HeapType sub_local;
  HeapType super_local;
  
  if (((sub.id != super.id) &&
      (local_30.id = sub.id, sub_local = super, bVar1 = HeapType::isBottom(&local_30), !bVar1)) &&
     (bVar1 = HeapType::isBottom(&sub_local), !bVar1)) {
    pVar2 = std::
            _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::HeapType>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::pair<wasm::HeapType_const,wasm::HeapType>>
                      ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::HeapType>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)&this->supertypes);
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      right.id = *(uintptr_t *)
                  ((long)pVar2.first.
                         super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>
                         ._M_cur.
                         super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>
                  + 0x10);
      if (sub_local.id != right.id) {
        bVar1 = HeapType::isSubType(sub_local,right);
        super_00 = sub_local;
        if (bVar1) {
          *(uintptr_t *)
           ((long)pVar2.first.
                  super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>.
                  _M_cur.
                  super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true> +
           0x10) = sub_local.id;
          UniqueDeferredQueue<wasm::HeapType>::push(&this->work,local_30);
          super_00.id = right.id;
          right = sub_local;
        }
        noteSubtype(this,right,super_00);
      }
    }
    else {
      UniqueDeferredQueue<wasm::HeapType>::push(&this->work,local_30);
    }
  }
  return;
}

Assistant:

void noteSubtype(HeapType sub, HeapType super) {
    if (sub == super || sub.isBottom() || super.isBottom()) {
      return;
    }

    auto [it, inserted] = supertypes.insert({sub, super});
    if (inserted) {
      work.push(sub);
      // TODO: Incrementally check all subtypes (inclusive) of sub against super
      // and all its supertypes if we have already analyzed casts.
      return;
    }
    // We already had a recorded supertype. The new supertype might be deeper,
    // shallower, or identical to the old supertype.
    auto oldSuper = it->second;
    if (super == oldSuper) {
      return;
    }
    // There are two different supertypes, but each type can only have a single
    // direct subtype so the supertype chain cannot fork and one of the
    // supertypes must be a supertype of the other. Recursively record that
    // relationship as well.
    if (HeapType::isSubType(super, oldSuper)) {
      // sub <: super <: oldSuper
      it->second = super;
      work.push(sub);
      // TODO: Incrementally check all subtypes (inclusive) of sub against super
      // if we have already analyzed casts.
      noteSubtype(super, oldSuper);
    } else {
      // sub <: oldSuper <: super
      noteSubtype(oldSuper, super);
    }
  }